

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

void usage(char *cmd,char *msg,...)

{
  char in_AL;
  iterator iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  allocator<char> local_f9;
  key_type local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (msg != (char *)0x0) {
    local_f8.field_2._M_allocated_capacity = (size_type)local_d8;
    local_f8._M_string_length = (size_type)&stack0x00000008;
    local_f8._M_dataplus._M_p = (pointer)0x3000000010;
    fprintf(_stderr,"imgtool %s: ",cmd);
    vfprintf(_stderr,msg,&local_f8);
    fwrite("\n\n",2,1,_stderr);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,cmd,&local_f9);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
          ::find(&commandUsage_abi_cxx11_._M_t,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  if ((_Rb_tree_header *)iVar1._M_node !=
      &commandUsage_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    fprintf(_stderr,"usage: imgtool %s\n\n",*(undefined8 *)(iVar1._M_node + 2));
    if (iVar1._M_node[3]._M_parent != (_Base_ptr)0x0) {
      fprintf(_stderr,"options:%s\n",*(undefined8 *)(iVar1._M_node + 3));
    }
    exit(1);
  }
  pbrt::LogFatal<char_const(&)[27]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
             ,0xba,"Check failed: %s",(char (*) [27])"iter != commandUsage.end()");
}

Assistant:

static void usage(const char *cmd, const char *msg = nullptr, ...) {
    if (msg != nullptr) {
        va_list args;
        va_start(args, msg);
        fprintf(stderr, "imgtool %s: ", cmd);
        vfprintf(stderr, msg, args);
        fprintf(stderr, "\n\n");
    }

    auto iter = commandUsage.find(cmd);
    CHECK(iter != commandUsage.end());
    fprintf(stderr, "usage: imgtool %s\n\n", iter->second.usage.c_str());
    if (!iter->second.options.empty())
        fprintf(stderr, "options:%s\n", iter->second.options.c_str());

    exit(1);
}